

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

SchnorrPubkey * __thiscall
cfd::core::TapBranch::GetTweakedPubkey
          (SchnorrPubkey *__return_storage_ptr__,TapBranch *this,SchnorrPubkey *internal_pubkey,
          bool *parity)

{
  ByteData256 hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  GetTapTweak((ByteData256 *)&_Stack_38,this,internal_pubkey);
  SchnorrPubkey::CreateTweakAdd
            (__return_storage_ptr__,internal_pubkey,(ByteData256 *)&_Stack_38,parity);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey TapBranch::GetTweakedPubkey(
    const SchnorrPubkey& internal_pubkey, bool* parity) const {
  ByteData256 hash = GetTapTweak(internal_pubkey);
  return internal_pubkey.CreateTweakAdd(hash, parity);
}